

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

int QUtf8::compareUtf8(QByteArrayView utf8,QStringView utf16,CaseSensitivity cs)

{
  bool bVar1;
  char32_t ucs4;
  qsizetype qVar2;
  byte *pbVar3;
  const_pointer pvVar4;
  int in_R8D;
  long in_FS_OFFSET;
  qsizetype res;
  char32_t uc2;
  char16_t *end2;
  qchar8_t *end1;
  undefined4 in_stack_0000003c;
  char32_t *output;
  qchar8_t **in_stack_00000048;
  char32_t uc1;
  char16_t *src2;
  qchar8_t *src1;
  qchar8_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  const_pointer dst;
  int local_4c;
  char32_t local_3c;
  const_pointer local_38;
  byte *local_30;
  QStringView local_28;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (byte *)QByteArrayView::data(&local_18);
  qVar2 = QByteArrayView::size(&local_18);
  pbVar3 = local_30 + qVar2;
  local_38 = QStringView::data(&local_28);
  qVar2 = QStringView::size(&local_28);
  dst = local_38 + qVar2;
  do {
    simdCompareAscii(in_stack_00000048,(qchar8_t *)output,
                     (char16_t **)CONCAT44(in_stack_0000003c,cs),(char16_t *)end1);
    if ((local_30 < pbVar3) && (local_38 < dst)) {
      local_3c = (char32_t)*local_30;
      pvVar4 = local_38 + 1;
      ucs4 = (char32_t)(ushort)local_38->ucs;
      if (0x7f < (uint)local_3c) {
        in_stack_ffffffffffffff90 =
             (qchar8_t *)
             QUtf8Functions::fromUtf8<QUtf8BaseTraitsNoAscii,char32_t*,qchar8_t_const*>
                       ((uchar)((ulong)pbVar3 >> 0x38),(char32_t **)dst,
                        (qchar8_t **)(ulong)CONCAT24(local_38->ucs,in_stack_ffffffffffffff98),
                        in_stack_ffffffffffffff90);
        if ((long)in_stack_ffffffffffffff90 < 0) {
          local_3c = L'�';
        }
        bVar1 = QChar::isHighSurrogate(ucs4);
        if (((bVar1) && (pvVar4 < dst)) &&
           (bVar1 = QChar::isLowSurrogate((uint)(ushort)pvVar4->ucs), bVar1)) {
          ucs4 = QChar::surrogateToUcs4((char16_t)ucs4,pvVar4->ucs);
          pvVar4 = local_38 + 2;
        }
      }
      local_38 = pvVar4;
      if (in_R8D == 0) {
        local_3c = QChar::toCaseFolded(L'\x00166b76');
        ucs4 = QChar::toCaseFolded(L'\x00166b83');
      }
      local_30 = local_30 + 1;
      if (local_3c != ucs4) {
        local_4c = local_3c - ucs4;
        goto LAB_00166bfd;
      }
    }
    if (pbVar3 <= local_30 || dst <= local_38) {
      local_4c = (uint)(local_30 < pbVar3) - (uint)(local_38 < dst);
LAB_00166bfd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_4c;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView utf8, QStringView utf16, Qt::CaseSensitivity cs) noexcept
{
    auto src1 = reinterpret_cast<const qchar8_t *>(utf8.data());
    auto end1 = src1 + utf8.size();
    auto src2 = reinterpret_cast<const char16_t *>(utf16.data());
    auto end2 = src2 + utf16.size();

    do {
        simdCompareAscii(src1, end1, src2, end2);

        if (src1 < end1 && src2 < end2) {
            char32_t uc1 = *src1++;
            char32_t uc2 = *src2++;

            if (uc1 >= 0x80) {
                char32_t *output = &uc1;
                qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraitsNoAscii>(uc1, output, src1, end1);
                if (res < 0) {
                    // decoding error
                    uc1 = QChar::ReplacementCharacter;
                }

                // Only decode the UTF-16 surrogate pair if the UTF-8 code point
                // wasn't US-ASCII (a surrogate cannot match US-ASCII).
                if (QChar::isHighSurrogate(uc2) && src2 < end2 && QChar::isLowSurrogate(*src2))
                    uc2 = QChar::surrogateToUcs4(uc2, *src2++);
            }
            if (cs == Qt::CaseInsensitive) {
                uc1 = QChar::toCaseFolded(uc1);
                uc2 = QChar::toCaseFolded(uc2);
            }
            if (uc1 != uc2)
                return int(uc1) - int(uc2);
        }
    } while (src1 < end1 && src2 < end2);

    // the shorter string sorts first
    return (end1 > src1) - int(end2 > src2);
}